

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ty.hpp
# Opt level: O0

void __thiscall mir::types::PtrTy::PtrTy(PtrTy *this,SharedTyPtr *item)

{
  shared_ptr<mir::types::Ty> *in_RSI;
  undefined8 *in_RDI;
  Ty *in_stack_ffffffffffffffd0;
  PtrTy *in_stack_ffffffffffffffe0;
  
  Ty::Ty(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR_display_0036feb8;
  std::shared_ptr<mir::types::Ty>::shared_ptr((shared_ptr<mir::types::Ty> *)(in_RDI + 1),in_RSI);
  reduce_array(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

PtrTy(SharedTyPtr item) : item(item) {
    // reduce "to" type to array item if it's an array
    reduce_array();
  }